

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O3

Mat __thiscall Mat::operator~(Mat *this)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  double *in_RDX;
  double *extraout_RDX;
  uint *in_RSI;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  Mat MVar9;
  
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  uVar8 = (ulong)uVar2;
  this->n_rows_ = uVar2;
  this->n_cols_ = uVar1;
  if ((int)(uVar1 * uVar2) < 1) {
    pdVar3 = (double *)0x0;
  }
  else {
    pdVar3 = (double *)operator_new__((ulong)(uVar1 * uVar2) << 3);
    in_RDX = extraout_RDX;
  }
  this->v_ = pdVar3;
  if (0 < (int)uVar1) {
    lVar4 = *(long *)(in_RSI + 2);
    in_RDX = (double *)(uVar8 * 8);
    uVar5 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar7 = 0;
        pdVar6 = pdVar3;
        do {
          *pdVar6 = *(double *)(lVar4 + uVar7 * 8);
          uVar7 = uVar7 + 1;
          pdVar6 = pdVar6 + uVar8;
        } while (uVar8 != uVar7);
      }
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + (long)in_RDX;
      pdVar3 = pdVar3 + 1;
    } while (uVar5 != uVar1);
  }
  MVar9.v_ = in_RDX;
  MVar9._0_8_ = this;
  return MVar9;
}

Assistant:

Mat Mat::operator~()
{
	Mat transpose(n_cols_, n_rows_);
	for (int i=0; i<n_rows_; i++)
		for(int j=0; j<n_cols_; j++)
			transpose.v_[j*n_cols_+i] = v_[i*n_cols_+j];
	return transpose;
}